

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopsops.c
# Opt level: O0

LispPTR LCFindVarIndex(LispPTR iv,LispPTR object)

{
  LispPTR LVar1;
  LispPTR *pLVar2;
  LCIVCacheEntry *pLVar3;
  uint local_34;
  int i;
  LispPTR tmp;
  LispPTR iNames;
  LCIVCacheEntry *ce;
  LCInstance *objptr;
  LispPTR object_local;
  LispPTR iv_local;
  
  if (atom_instance == 0) {
    LCinit();
  }
  if (((*(uint *)(DTDspace +
                 (long)(int)((*(ushort *)((ulong)(MDStypetbl + (object >> 9)) ^ 2) & 0x7ff) << 4) +
                 (long)(int)((*(ushort *)((ulong)(MDStypetbl + (object >> 9)) ^ 2) & 0x7ff) << 1)) &
       0xfffffff) == atom_instance) ||
     ((*(uint *)(DTDspace +
                (long)(int)((*(ushort *)((ulong)(MDStypetbl + (object >> 9)) ^ 2) & 0x7ff) << 4) +
                (long)(int)((*(ushort *)((ulong)(MDStypetbl + (object >> 9)) ^ 2) & 0x7ff) << 1)) &
      0xfffffff) == atom_class)) {
    pLVar2 = NativeAligned4FromLAddr(object);
    i = pLVar2[1];
    pLVar3 = LCIVCache + ((i ^ iv) & 0x3ff);
    if ((pLVar3->iNames == i) && (pLVar3->iv == iv)) {
      object_local = pLVar3->index;
    }
    else if ((*(ushort *)((ulong)(MDStypetbl + ((uint)i >> 9)) ^ 2) & 0x7ff) == 5) {
      local_34 = 0;
      while (i = cdr(i), i != 0) {
        LVar1 = car(i);
        if (LVar1 == iv) {
          pLVar3->iNames = pLVar2[1];
          pLVar3->iv = iv;
          pLVar3->index = local_34 | 0xe0000;
          return local_34 | 0xe0000;
        }
        local_34 = local_34 + 1;
      }
      object_local = 0;
    }
    else {
      object_local = 0;
    }
  }
  else {
    object_local = lcfuncall(atom_FindVarIndex_LCUFN,2,3);
  }
  return object_local;
}

Assistant:

LispPTR LCFindVarIndex(LispPTR iv, LispPTR object) {
  struct LCInstance *objptr;
  struct LCIVCacheEntry *ce;
  LispPTR iNames;

  LC_INIT;

  INSTANCE_CLASS_OR_PUNT(object, atom_FindVarIndex_LCUFN, 2);

  objptr = (struct LCInstance *)NativeAligned4FromLAddr(object);
  ce = &(LCIVCache[IV_CACHE_INDEX((iNames = objptr->iNames), iv)]);
  if (ce->iNames == iNames && ce->iv == iv) return ce->index;

  if (!Listp(iNames)) return NIL_PTR; /* FastFindIndex lisp macro (& others?) */
                                      /* needs this check too ! */
  {
    int i;

    for (i = 0; (iNames = cdr(iNames)) != NIL_PTR; i++) {
      if (car(iNames) == iv) {
        ce->iNames = objptr->iNames;
        ce->iv = iv;
        return (ce->index = SMALLP_FROM_POSINT(i));
      }
    }
    return NIL_PTR;
  }
}